

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly345.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Poly345::ArchiveOUT(ChFunction_Poly345 *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Poly345>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30 = &this->h;
  local_38 = "h";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->end;
  local_38 = "end";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Poly345::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Poly345>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(h);
    marchive << CHNVP(end);
}